

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O0

void __thiscall IR::Print::visit(Print *this,CJump *cj)

{
  BasicBlock *pBVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  int iVar3;
  BasicBlock *pBVar4;
  Expr *pEVar5;
  undefined4 extraout_var;
  Symbol *pSVar6;
  undefined4 extraout_var_00;
  string *psVar7;
  undefined4 extraout_var_01;
  int local_d4;
  CharLiteral *local_d0;
  CharLiteral *literal;
  Code *local_c0;
  Code *code;
  string *local_98;
  string *id;
  Name *name;
  undefined1 local_80 [8];
  string binop;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string unop;
  BasicBlock *cont;
  BasicBlock *target;
  CJump *cj_local;
  Print *this_local;
  
  target = (BasicBlock *)cj;
  cj_local = (CJump *)this;
  cont = CJump::iftrue(cj);
  unop.field_2._8_8_ = CJump::iffalse((CJump *)target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"==",(allocator<char> *)((long)&name + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
  pBVar1 = this->nextBlock_;
  pBVar4 = CJump::iftrue((CJump *)target);
  if (pBVar1 == pBVar4) {
    std::swap<IR::BasicBlock*>(&cont,(BasicBlock **)((long)&unop.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_48,"!");
    std::__cxx11::string::operator=((string *)local_80,"!=");
  }
  pEVar5 = CJump::cond((CJump *)target);
  iVar3 = (*pEVar5->_vptr_Expr[3])();
  id = (string *)CONCAT44(extraout_var,iVar3);
  if (id == (string *)0x0) {
    pEVar5 = CJump::cond((CJump *)target);
    iVar3 = (*pEVar5->_vptr_Expr[5])();
    local_c0 = (Code *)CONCAT44(extraout_var_00,iVar3);
    if (local_c0 == (Code *)0x0) {
      pEVar5 = CJump::cond((CJump *)target);
      iVar3 = (*pEVar5->_vptr_Expr[6])();
      local_d0 = (CharLiteral *)CONCAT44(extraout_var_01,iVar3);
      if (local_d0 == (CharLiteral *)0x0) {
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                      ,0x97,"virtual void IR::Print::visit(IR::CJump *)");
      }
      if ((fLB::FLAGS_lines & 1) != 0) {
        std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
        pbVar2 = this->out;
        local_d4 = CharLiteral::line(local_d0);
        fmt::v7::print<char[16],int,std::__cxx11::string&,char>
                  (pbVar2,(char (*) [16])"#line {0} \"{1}\"",&local_d4,fLS::FLAGS_input_abi_cxx11_);
        std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
      }
      pbVar2 = this->out;
      psVar7 = CharLiteral::value_abi_cxx11_(local_d0);
      fmt::v7::print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (pbVar2,(char (*) [35])"\tif (yytoken() {0} {1}) goto L{2};",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 psVar7,&cont->index);
      std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (((fLB::FLAGS_lines & 1) != 0) && (iVar3 = Code::line(local_c0), iVar3 != 1)) {
        std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
        pbVar2 = this->out;
        literal._4_4_ = Code::line(local_c0);
        fmt::v7::print<char[16],int,std::__cxx11::string&,char>
                  (pbVar2,(char (*) [16])"#line {0} \"{1}\"",(int *)((long)&literal + 4),
                   fLS::FLAGS_input_abi_cxx11_);
        std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
      }
      pbVar2 = this->out;
      psVar7 = Code::text_abi_cxx11_(local_c0);
      fmt::v7::print<char[60],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (pbVar2,(char (*) [60])
                        "\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 psVar7,&cont->index);
      std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    if ((fLB::FLAGS_lines & 1) != 0) {
      std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
      pbVar2 = this->out;
      pSVar6 = Name::sym((Name *)id);
      fmt::v7::print<char[16],int&,std::__cxx11::string&,char>
                (pbVar2,(char (*) [16])"#line {0} \"{1}\"",&pSVar6->line,fLS::FLAGS_input_abi_cxx11_
                );
      std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
    }
    pSVar6 = Name::sym((Name *)id);
    local_98 = &pSVar6->name;
    pSVar6 = Name::sym((Name *)id);
    psVar7 = local_98;
    if ((pSVar6->isTerminal & 1U) == 0) {
      pbVar2 = this->out;
      pSVar6 = Name::sym((Name *)id);
      fmt::v7::
      print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,int&,char>
                (pbVar2,(char (*) [35])"\tif ({0}parse_{1}({2})) goto L{3};",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 psVar7,&pSVar6->extra,&cont->index);
    }
    else {
      pbVar2 = this->out;
      anon_unknown_15::tokenName((string *)&code,local_98);
      fmt::v7::print<char[35],std::__cxx11::string&,std::__cxx11::string,int&,char>
                (pbVar2,(char (*) [35])"\tif (yytoken() {0} {1}) goto L{2};",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code,
                 &cont->index);
      std::__cxx11::string::~string((string *)&code);
    }
    std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  }
  if ((BasicBlock *)unop.field_2._8_8_ != this->nextBlock_) {
    fmt::v7::print<char[12],int&,char>
              (this->out,(char (*) [12])"\tgoto L{0};",(int *)(unop.field_2._8_8_ + 0x20));
    std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Print::visit(IR::CJump* cj) {
  IR::BasicBlock* target = cj->iftrue();
  IR::BasicBlock* cont = cj->iffalse();
  std::string unop = "";
  std::string binop = "==";

  if (nextBlock_ == cj->iftrue()) {
    std::swap(target, cont);
    unop = "!";
    binop = "!=";
  }

  if (auto name = cj->cond()->asName()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", name->sym()->line, FLAGS_input);
      out << std::endl;
    }

    const auto& id = name->sym()->name;

    if (name->sym()->isTerminal) {
      fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
                 tokenName(id), target->index);
    } else {
      fmt::print(out, "\tif ({0}parse_{1}({2})) goto L{3};", unop, id,
                 name->sym()->extra, target->index);
    }
    out << std::endl;
  } else if (auto code = cj->cond()->asCode()) {
    if (FLAGS_lines && code->line() != 1) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", code->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out,
               "\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
               unop, code->text(), target->index);

    out << std::endl;
  } else if (auto literal = cj->cond()->asCharLiteral()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", literal->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
               literal->value(), target->index);

    out << std::endl;
  } else {
    assert(!"unreachable");
  }

  if (cont != nextBlock_) {
    fmt::print(out, "\tgoto L{0};", cont->index);
    out << std::endl;
  }
}